

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adler32_sse42.c
# Opt level: O0

uint32_t adler32_fold_copy_sse42(uint32_t adler,uint8_t *dst,uint8_t *src,size_t len)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 *puVar8;
  uint32_t uVar9;
  undefined1 (*pauVar10) [16];
  ulong in_RCX;
  undefined1 (*in_RDX) [16];
  uint8_t *in_RSI;
  longlong in_RDI;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  __m128i x;
  __m128i x_00;
  size_t k;
  __m128i dot3v;
  __m128i dot2v_0;
  __m128i dot2v;
  __m128i zero;
  __m128i vsum2_0;
  __m128i vsum2;
  __m128i v_sad_sum2;
  __m128i v_short_sum2_0;
  __m128i v_short_sum2;
  __m128i v_sad_sum1;
  __m128i vs2_0;
  __m128i vs2;
  __m128i vs1;
  __m128i vs3;
  __m128i vs1_0;
  __m128i vbuf_0;
  __m128i vbuf;
  uint32_t adler1;
  uint32_t adler0;
  ulong local_5d0;
  ulong local_5c0;
  uint32_t local_4a0;
  uint32_t local_49c;
  ulong local_498;
  undefined1 (*local_490) [16];
  uint8_t *local_488;
  
  local_4a0 = (uint)in_RDI >> 0x10;
  local_49c = (uint)in_RDI & 0xffff;
  local_498 = in_RCX;
  local_490 = in_RDX;
  local_488 = in_RSI;
  do {
    if (local_498 < 0x10) {
      uVar9 = adler32_copy_len_16(local_49c,(uint8_t *)local_490,local_488,local_498,local_4a0);
      return uVar9;
    }
    in_RDI = CONCAT71((int7)((ulong)in_RDI >> 8),0xc);
    in_RSI = (uint8_t *)CONCAT71((int7)((ulong)in_RSI >> 8),0xd);
    while (0xf < local_498) {
      if (local_498 < 0x15b1) {
        local_5d0 = local_498;
      }
      else {
        local_5d0 = 0x15b0;
      }
      local_5c0 = local_5d0 & 0xfffffffffffffff0;
      local_498 = local_498 - local_5c0;
      while (0x1f < local_5c0) {
        puVar8 = *local_490;
        uVar1 = *(undefined8 *)(*local_490 + 8);
        auVar6 = *local_490;
        auVar12 = *local_490;
        pauVar10 = local_490 + 1;
        uVar2 = *(undefined8 *)*pauVar10;
        uVar3 = *(undefined8 *)(local_490[1] + 8);
        auVar7 = *pauVar10;
        local_490 = local_490 + 2;
        local_5c0 = local_5c0 - 0x20;
        psadbw(auVar12,ZEXT816(0));
        psadbw(*pauVar10,ZEXT816(0));
        *(undefined8 *)local_488 = *(undefined8 *)puVar8;
        *(undefined8 *)(local_488 + 8) = uVar1;
        *(undefined8 *)(local_488 + 0x10) = uVar2;
        *(undefined8 *)(local_488 + 0x18) = uVar3;
        local_488 = local_488 + 0x20;
        auVar11._8_8_ = 0x1112131415161718;
        auVar11._0_8_ = 0x191a1b1c1d1e1f20;
        auVar11 = pmaddubsw(auVar6,auVar11);
        auVar12._8_8_ = 0x102030405060708;
        auVar12._0_8_ = 0x90a0b0c0d0e0f10;
        auVar12 = pmaddubsw(auVar7,auVar12);
        auVar7._8_8_ = 0x1000100010001;
        auVar7._0_8_ = 0x1000100010001;
        pmaddwd(auVar11,auVar7);
        auVar6._8_8_ = 0x1000100010001;
        auVar6._0_8_ = 0x1000100010001;
        pmaddwd(auVar12,auVar6);
      }
      while (0xf < local_5c0) {
        puVar8 = *local_490;
        uVar1 = *(undefined8 *)(*local_490 + 8);
        auVar11 = *local_490;
        auVar12 = *local_490;
        local_490 = local_490 + 1;
        local_5c0 = local_5c0 - 0x10;
        psadbw(auVar12,ZEXT816(0));
        auVar4._8_8_ = 0x102030405060708;
        auVar4._0_8_ = 0x90a0b0c0d0e0f10;
        auVar12 = pmaddubsw(auVar11,auVar4);
        auVar5._8_8_ = 0x1000100010001;
        auVar5._0_8_ = 0x1000100010001;
        pmaddwd(auVar12,auVar5);
        *(undefined8 *)local_488 = *(undefined8 *)puVar8;
        *(undefined8 *)(local_488 + 8) = uVar1;
        local_488 = local_488 + 0x10;
      }
      x[1] = (longlong)in_RSI;
      x[0] = in_RDI;
      uVar9 = partial_hsum(x);
      local_49c = uVar9 % 0xfff1;
      x_00[1] = (longlong)in_RSI;
      x_00[0] = in_RDI;
      uVar9 = hsum(x_00);
      local_4a0 = uVar9 % 0xfff1;
    }
  } while (local_498 != 0);
  return local_49c | local_4a0 << 0x10;
}

Assistant:

Z_INTERNAL uint32_t adler32_fold_copy_sse42(uint32_t adler, uint8_t *dst, const uint8_t *src, size_t len) {
    uint32_t adler0, adler1;
    adler1 = (adler >> 16) & 0xffff;
    adler0 = adler & 0xffff;

rem_peel:
    if (len < 16) {
       return adler32_copy_len_16(adler0, src, dst, len, adler1);
    }

    __m128i vbuf, vbuf_0;
    __m128i vs1_0, vs3, vs1, vs2, vs2_0, v_sad_sum1, v_short_sum2, v_short_sum2_0,
            v_sad_sum2, vsum2, vsum2_0;
    __m128i zero = _mm_setzero_si128();
    const __m128i dot2v = _mm_setr_epi8(32, 31, 30, 29, 28, 27, 26, 25, 24, 23, 22, 21, 20, 19, 18, 17);
    const __m128i dot2v_0 = _mm_setr_epi8(16, 15, 14, 13, 12, 11, 10, 9, 8, 7, 6, 5, 4, 3, 2, 1);
    const __m128i dot3v = _mm_set1_epi16(1);
    size_t k;

    while (len >= 16) {

        k = MIN(len, NMAX);
        k -= k % 16;
        len -= k;

        vs1 = _mm_cvtsi32_si128(adler0);
        vs2 = _mm_cvtsi32_si128(adler1);

        vs3 = _mm_setzero_si128();
        vs2_0 = _mm_setzero_si128();
        vs1_0 = vs1;

        while (k >= 32) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            vbuf_0 = _mm_loadu_si128((__m128i*)(src + 16));
            src += 32;
            k -= 32;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_sad_sum2 = _mm_sad_epu8(vbuf_0, zero);
            _mm_storeu_si128((__m128i*)dst, vbuf);
            _mm_storeu_si128((__m128i*)(dst + 16), vbuf_0);
            dst += 32;

            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v);
            v_short_sum2_0 = _mm_maddubs_epi16(vbuf_0, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);

            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vsum2_0 = _mm_madd_epi16(v_short_sum2_0, dot3v);
            vs1 = _mm_add_epi32(v_sad_sum2, vs1);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs2_0 = _mm_add_epi32(vsum2_0, vs2_0);
            vs1_0 = vs1;
        }

        vs2 = _mm_add_epi32(vs2_0, vs2);
        vs3 = _mm_slli_epi32(vs3, 5);
        vs2 = _mm_add_epi32(vs3, vs2);
        vs3 = _mm_setzero_si128();

        while (k >= 16) {
            /*
               vs1 = adler + sum(c[i])
               vs2 = sum2 + 16 vs1 + sum( (16-i+1) c[i] )
            */
            vbuf = _mm_loadu_si128((__m128i*)src);
            src += 16;
            k -= 16;

            v_sad_sum1 = _mm_sad_epu8(vbuf, zero);
            v_short_sum2 = _mm_maddubs_epi16(vbuf, dot2v_0);

            vs1 = _mm_add_epi32(v_sad_sum1, vs1);
            vs3 = _mm_add_epi32(vs1_0, vs3);
            vsum2 = _mm_madd_epi16(v_short_sum2, dot3v);
            vs2 = _mm_add_epi32(vsum2, vs2);
            vs1_0 = vs1;

            _mm_storeu_si128((__m128i*)dst, vbuf);
            dst += 16;
        }

        vs3 = _mm_slli_epi32(vs3, 4);
        vs2 = _mm_add_epi32(vs2, vs3);

        adler0 = partial_hsum(vs1) % BASE;
        adler1 = hsum(vs2) % BASE;
    }

    /* If this is true, there's fewer than 16 elements remaining */
    if (len) {
        goto rem_peel;
    }

    return adler0 | (adler1 << 16);
}